

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

int libtorrent::aux::anon_unknown_2::utf8_sequence_length(char c)

{
  undefined4 local_c;
  uint8_t b;
  char c_local;
  
  if ((byte)c < 0x80) {
    local_c = 1;
  }
  else if ((int)(uint)(byte)c >> 5 == 6) {
    local_c = 2;
  }
  else if ((int)(uint)(byte)c >> 4 == 0xe) {
    local_c = 3;
  }
  else if ((int)(uint)(byte)c >> 3 == 0x1e) {
    local_c = 4;
  }
  else if ((int)(uint)(byte)c >> 2 == 0x3e) {
    local_c = 5;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int utf8_sequence_length(char const c)
	{
		auto const b = static_cast<std::uint8_t>(c);
		if (b < 0b10000000) return 1;
		if ((b >> 5) == 0b110) return 2;
		if ((b >> 4) == 0b1110) return 3;
		if ((b >> 3) == 0b11110) return 4;
		// this is an invalid prefix, but we still parse it to skip this many
		// bytes
		if ((b >> 2) == 0b111110) return 5;
		return 0;
	}